

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall
re2::Prog::SearchDFA
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match0,bool *failed,vector<int,_std::allocator<int>_> *matches)

{
  char *data;
  undefined8 this_00;
  bool bVar1;
  iterator pcVar2;
  iterator pcVar3;
  iterator local_98;
  bool local_81;
  iterator pcStack_60;
  bool matched;
  char *ep;
  DFA *dfa;
  undefined1 auStack_48 [2];
  bool want_shortest_match;
  bool endmatch;
  bool anchored;
  bool t;
  bool dollar;
  bool carat;
  StringPiece context;
  StringPiece *match0_local;
  MatchKind kind_local;
  Anchor anchor_local;
  StringPiece *const_context_local;
  StringPiece *text_local;
  Prog *this_local;
  
  *failed = false;
  _auStack_48 = const_context->ptr_;
  context.ptr_ = *(char **)&const_context->length_;
  context._8_8_ = match0;
  pcVar2 = StringPiece::begin((StringPiece *)auStack_48);
  if (pcVar2 == (iterator)0x0) {
    _auStack_48 = text->ptr_;
    context.ptr_ = (char *)CONCAT44(context.ptr_._4_4_,text->length_);
  }
  dfa._7_1_ = anchor_start(this);
  bVar1 = anchor_end(this);
  dfa._6_1_ = bVar1;
  if ((this->reversed_ & 1U) != 0) {
    dfa._5_1_ = dfa._7_1_ & 1;
    dfa._6_1_ = dfa._5_1_;
    dfa._7_1_ = bVar1;
  }
  if ((dfa._7_1_ & 1) != 0) {
    pcVar2 = StringPiece::begin((StringPiece *)auStack_48);
    pcVar3 = StringPiece::begin(text);
    if (pcVar2 != pcVar3) {
      return false;
    }
  }
  if ((dfa._6_1_ & 1) != 0) {
    pcVar2 = StringPiece::end((StringPiece *)auStack_48);
    pcVar3 = StringPiece::end(text);
    if (pcVar2 != pcVar3) {
      return false;
    }
  }
  local_81 = true;
  if (anchor != kAnchored) {
    bVar1 = anchor_start(this);
    local_81 = true;
    if (!bVar1) {
      local_81 = kind == kFullMatch;
    }
  }
  dfa._4_1_ = local_81;
  dfa._3_1_ = 0;
  match0_local._0_4_ = kind;
  if (kind == kManyMatch) {
    dfa._3_1_ = 1;
  }
  else if ((kind == kFullMatch) || (bVar1 = anchor_end(this), bVar1)) {
    dfa._3_1_ = 1;
    match0_local._0_4_ = kLongestMatch;
  }
  dfa._2_1_ = 0;
  if ((context._8_8_ == 0) && ((dfa._3_1_ & 1) == 0)) {
    dfa._2_1_ = 1;
    match0_local._0_4_ = kLongestMatch;
  }
  ep = (char *)GetDFA(this,(MatchKind)match0_local);
  bVar1 = DFA::Search((DFA *)ep,text,(StringPiece *)auStack_48,(bool)(dfa._4_1_ & 1),
                      (bool)(dfa._2_1_ & 1),(bool)((this->reversed_ ^ 0xffU) & 1),failed,
                      &stack0xffffffffffffffa0,matches);
  pcVar2 = pcStack_60;
  if ((*failed & 1U) == 0) {
    if (bVar1) {
      if ((dfa._3_1_ & 1) != 0) {
        if ((this->reversed_ & 1U) == 0) {
          local_98 = StringPiece::end(text);
        }
        else {
          local_98 = StringPiece::begin(text);
        }
        if (pcVar2 != local_98) {
          return false;
        }
      }
      this_00 = context._8_8_;
      data = pcStack_60;
      if (context._8_8_ != 0) {
        if ((this->reversed_ & 1U) == 0) {
          pcVar2 = StringPiece::begin(text);
          pcVar3 = StringPiece::begin(text);
          StringPiece::set((StringPiece *)this_00,pcVar2,(int)pcStack_60 - (int)pcVar3);
        }
        else {
          pcVar2 = StringPiece::end(text);
          StringPiece::set((StringPiece *)this_00,data,(int)pcVar2 - (int)pcStack_60);
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Prog::SearchDFA(const StringPiece& text, const StringPiece& const_context,
                     Anchor anchor, MatchKind kind,
                     StringPiece* match0, bool* failed, vector<int>* matches) {
  *failed = false;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;
  bool carat = anchor_start();
  bool dollar = anchor_end();
  if (reversed_) {
    bool t = carat;
    carat = dollar;
    dollar = t;
  }
  if (carat && context.begin() != text.begin())
    return false;
  if (dollar && context.end() != text.end())
    return false;

  // Handle full match by running an anchored longest match
  // and then checking if it covers all of text.
  bool anchored = anchor == kAnchored || anchor_start() || kind == kFullMatch;
  bool endmatch = false;
  if (kind == kManyMatch) {
    endmatch = true;
  } else if (kind == kFullMatch || anchor_end()) {
    endmatch = true;
    kind = kLongestMatch;
  }

  // If the caller doesn't care where the match is (just whether one exists),
  // then we can stop at the very first match we find, the so-called
  // "shortest match".
  bool want_shortest_match = false;
  if (match0 == NULL && !endmatch) {
    want_shortest_match = true;
    kind = kLongestMatch;
  }

  DFA* dfa = GetDFA(kind);
  const char* ep;
  bool matched = dfa->Search(text, context, anchored,
                             want_shortest_match, !reversed_,
                             failed, &ep, matches);
  if (*failed)
    return false;
  if (!matched)
    return false;
  if (endmatch && ep != (reversed_ ? text.begin() : text.end()))
    return false;

  // If caller cares, record the boundary of the match.
  // We only know where it ends, so use the boundary of text
  // as the beginning.
  if (match0) {
    if (reversed_)
      match0->set(ep, static_cast<int>(text.end() - ep));
    else
      match0->set(text.begin(), static_cast<int>(ep - text.begin()));
  }
  return true;
}